

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O2

void __thiscall re2::BitState::Push(BitState *this,int id,char *p,int arg)

{
  int iVar1;
  Job *pJVar2;
  bool bVar3;
  
  if ((this->maxjob_ <= this->njob_) && (bVar3 = GrowStack(this), !bVar3)) {
    return;
  }
  if ((~this->prog_->inst_[id].out_opcode_ & 7) != 0) {
    if ((arg == 0) && (bVar3 = ShouldVisit(this,id,p), !bVar3)) {
      return;
    }
    pJVar2 = this->job_;
    iVar1 = this->njob_;
    this->njob_ = iVar1 + 1;
    pJVar2[iVar1].id = id;
    pJVar2[iVar1].p = p;
    pJVar2[iVar1].arg = arg;
  }
  return;
}

Assistant:

void BitState::Push(int id, const char* p, int arg) {
  if (njob_ >= maxjob_) {
    if (!GrowStack())
      return;
  }
  int op = prog_->inst(id)->opcode();
  if (op == kInstFail)
    return;

  // Only check ShouldVisit when arg == 0.
  // When arg > 0, we are continuing a previous visit.
  if (arg == 0 && !ShouldVisit(id, p))
    return;

  Job* j = &job_[njob_++];
  j->id = id;
  j->p = p;
  j->arg = arg;
}